

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x_x509a.cc
# Opt level: O0

uchar * X509_keyid_get0(X509 *x,int *len)

{
  uchar *local_38;
  int local_2c;
  _func_257 *local_28;
  ASN1_OCTET_STRING *keyid;
  int *out_len_local;
  X509 *x_local;
  
  if (x->altname == (stack_st_GENERAL_NAME *)0x0) {
    local_28 = (_func_257 *)0x0;
  }
  else {
    local_28 = (x->altname->stack).comp;
  }
  if (len != (int *)0x0) {
    if (local_28 == (_func_257 *)0x0) {
      local_2c = 0;
    }
    else {
      local_2c = *(int *)local_28;
    }
    *len = local_2c;
  }
  if (local_28 == (_func_257 *)0x0) {
    local_38 = (uchar *)0x0;
  }
  else {
    local_38 = *(uchar **)(local_28 + 8);
  }
  return local_38;
}

Assistant:

const uint8_t *X509_keyid_get0(const X509 *x, int *out_len) {
  const ASN1_OCTET_STRING *keyid = x->aux != NULL ? x->aux->keyid : NULL;
  if (out_len != NULL) {
    *out_len = keyid != NULL ? keyid->length : 0;
  }
  return keyid != NULL ? keyid->data : NULL;
}